

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_open_memory.c
# Opt level: O0

int read_open_memory_internal(archive *a,void *buff,size_t size,size_t read_size,int level)

{
  int iVar1;
  archive *_a;
  void *pvVar2;
  archive *in_RCX;
  long in_RDX;
  archive_vtable_conflict *in_RSI;
  archive *in_RDI;
  int in_R8D;
  read_memory_data *mine;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  
  _a = (archive *)malloc(0x38);
  if (_a == (archive *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    return -0x1e;
  }
  *(undefined8 *)&_a->compression_code = 0;
  _a->compression_name = (char *)0x0;
  *(undefined8 *)&_a->archive_format = 0;
  _a->archive_format_name = (char *)0x0;
  _a->magic = 0;
  _a->state = 0;
  _a->vtable = (archive_vtable_conflict *)0x0;
  _a->file_count = 0;
  _a->archive_error_number = 0;
  _a->vtable = in_RSI;
  *(archive_vtable_conflict **)_a = in_RSI;
  *(long *)&_a->archive_format = *(long *)_a + in_RDX;
  _a->archive_format_name = (char *)in_RCX;
  _a->compression_name = (char *)0x20;
  *(char **)&_a->compression_code = (char *)((long)&in_RCX->magic + (long)_a->compression_name * 2);
  pvVar2 = malloc(*(size_t *)&_a->compression_code);
  *(void **)&_a->file_count = pvVar2;
  memset(*(void **)&_a->file_count,0xa5,*(size_t *)&_a->compression_code);
  if (in_R8D != 1) {
    if (in_R8D != 2) {
      if (in_R8D != 3) goto LAB_00120d09;
      archive_read_set_seek_callback
                (_a,(archive_seek_callback *)CONCAT44(3,in_stack_ffffffffffffffc0));
    }
    archive_read_set_open_callback(_a,(undefined1 *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0));
    archive_read_set_skip_callback
              (_a,(archive_skip_callback *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0));
  }
  archive_read_set_read_callback
            (_a,(archive_read_callback *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0));
  archive_read_set_close_callback(_a,(undefined1 *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0));
  archive_read_set_callback_data
            ((archive *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
LAB_00120d09:
  iVar1 = archive_read_open1(in_RCX);
  return iVar1;
}

Assistant:

static int
read_open_memory_internal(struct archive *a, void *buff,
    size_t size, size_t read_size, int level)
{
	struct read_memory_data *mine;

	mine = (struct read_memory_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	memset(mine, 0, sizeof(*mine));
	mine->start = mine->p = (unsigned char *)buff;
	mine->end = mine->start + size;
	mine->read_size = read_size;
	mine->copy_buff_offset = 32;
	mine->copy_buff_size = read_size + mine->copy_buff_offset * 2;
	mine->copy_buff = malloc(mine->copy_buff_size);
	memset(mine->copy_buff, 0xA5, mine->copy_buff_size);

	switch (level) {
	case 3:
		archive_read_set_seek_callback(a, memory_read_seek);
	case 2:
		archive_read_set_open_callback(a, memory_read_open);
		archive_read_set_skip_callback(a, memory_read_skip);
	case 1:
		archive_read_set_read_callback(a, memory_read);
		archive_read_set_close_callback(a, memory_read_close);
		archive_read_set_callback_data(a, mine);
	}
	return archive_read_open1(a);
}